

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowUpdate(Parse *pParse,Window *pList,Window *pWin,FuncDef *pFunc)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  sqlite3 *psVar6;
  Vdbe *pVVar7;
  ExprList *pEVar8;
  Expr *pEVar9;
  Window *in_RCX;
  Parse *in_RDX;
  Parse *in_RDI;
  long in_FS_OFFSET;
  int i;
  sqlite3 *db;
  Window *p;
  WindowUpdate aUp [8];
  Expr *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int op;
  Window *in_stack_ffffffffffffff08;
  Parse *in_stack_ffffffffffffff10;
  undefined1 local_c8 [4];
  int in_stack_ffffffffffffff3c;
  ExprList *in_stack_ffffffffffffff40;
  sqlite3 *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX->db == (sqlite3 *)0x0) || (in_RDX->isMultiWrite != '\0')) {
    sqlite3WindowChain(in_RDX,in_RCX,(Window *)in_stack_ffffffffffffff10);
  }
  else {
    psVar6 = (sqlite3 *)
             windowFind(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    if (psVar6 == (sqlite3 *)0x0) goto LAB_001dbd3a;
    pVVar7 = (Vdbe *)sqlite3ExprListDup(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                        in_stack_ffffffffffffff3c);
    in_RDX->pVdbe = pVVar7;
    pEVar8 = sqlite3ExprListDup(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                in_stack_ffffffffffffff3c);
    *(ExprList **)&in_RDX->rc = pEVar8;
    pEVar9 = sqlite3ExprDup(psVar6,(Expr *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    *(Expr **)&in_RDX->mSubrtnSig = pEVar9;
    pEVar9 = sqlite3ExprDup(psVar6,(Expr *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    *(Expr **)&in_RDX->iRangeReg = pEVar9;
    in_RDX->mayAbort = *(u8 *)((long)&psVar6->aDb + 1);
    in_RDX->hasCompound = *(u8 *)((long)&psVar6->aDb + 2);
    in_RDX->isMultiWrite = *(u8 *)&psVar6->aDb;
    in_RDX->disableLookaside = *(u8 *)((long)&psVar6->aDb + 4);
  }
  if (((in_RDX->isMultiWrite == 'Z') &&
      ((lVar2._0_1_ = in_RDX->mSubrtnSig, lVar2._1_3_ = *(undefined3 *)&in_RDX->field_0x29,
       lVar2._4_4_ = in_RDX->nRangeReg, lVar2 != 0 ||
       (lVar3._0_4_ = in_RDX->iRangeReg, lVar3._4_4_ = in_RDX->nErr, lVar3 != 0)))) &&
     ((lVar4._0_4_ = in_RDX->rc, lVar4._4_1_ = in_RDX->colNamesSet,
      lVar4._5_1_ = in_RDX->checkSchema, lVar4._6_1_ = in_RDX->nested,
      lVar4._7_1_ = in_RDX->nTempReg, lVar4 == 0 || (**(int **)&in_RDX->rc != 1)))) {
    sqlite3ErrorMsg(in_RDI,"RANGE with offset PRECEDING/FOLLOWING requires one ORDER BY expression")
    ;
  }
  else if (((ulong)in_RCX->zName & 0x1000000000000) != 0) {
    psVar6 = in_RDI->db;
    lVar5._0_4_ = in_RDX->nLabel;
    lVar5._4_4_ = in_RDX->nLabelAlloc;
    if (lVar5 == 0) {
      memcpy(local_c8,&PTR_row_numberName_002e5460,0xc0);
      for (op = 0; op < 8; op = op + 1) {
        if (in_RCX->ppThis == *(Window ***)(local_c8 + (long)op * 0x18)) {
          sqlite3ExprDelete((sqlite3 *)CONCAT44(op,in_stack_ffffffffffffff00),
                            in_stack_fffffffffffffef8);
          sqlite3ExprDelete((sqlite3 *)CONCAT44(op,in_stack_ffffffffffffff00),
                            in_stack_fffffffffffffef8);
          in_RDX->mSubrtnSig = '\0';
          *(undefined3 *)&in_RDX->field_0x29 = 0;
          in_RDX->nRangeReg = 0;
          in_RDX->iRangeReg = 0;
          in_RDX->nErr = 0;
          in_RDX->isMultiWrite = (u8)*(undefined4 *)(&stack0xffffffffffffff40 + (long)op * 0x18);
          in_RDX->mayAbort = (u8)*(undefined4 *)(&stack0xffffffffffffff44 + (long)op * 0x18);
          in_RDX->hasCompound = (u8)*(undefined4 *)(&stack0xffffffffffffff48 + (long)op * 0x18);
          in_RDX->disableLookaside = '\0';
          if (in_RDX->mayAbort == 'W') {
            pEVar9 = sqlite3Expr(psVar6,op,(char *)in_stack_fffffffffffffef8);
            *(Expr **)&in_RDX->mSubrtnSig = pEVar9;
          }
          break;
        }
      }
    }
    else {
      sqlite3ErrorMsg(in_RDI,"FILTER clause may only be used with aggregate window functions");
    }
  }
  in_RDX->aLabel = (int *)in_RCX;
LAB_001dbd3a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowUpdate(
  Parse *pParse,
  Window *pList,                  /* List of named windows for this SELECT */
  Window *pWin,                   /* Window frame to update */
  FuncDef *pFunc                  /* Window function definition */
){
  if( pWin->zName && pWin->eFrmType==0 ){
    Window *p = windowFind(pParse, pList, pWin->zName);
    if( p==0 ) return;
    pWin->pPartition = sqlite3ExprListDup(pParse->db, p->pPartition, 0);
    pWin->pOrderBy = sqlite3ExprListDup(pParse->db, p->pOrderBy, 0);
    pWin->pStart = sqlite3ExprDup(pParse->db, p->pStart, 0);
    pWin->pEnd = sqlite3ExprDup(pParse->db, p->pEnd, 0);
    pWin->eStart = p->eStart;
    pWin->eEnd = p->eEnd;
    pWin->eFrmType = p->eFrmType;
    pWin->eExclude = p->eExclude;
  }else{
    sqlite3WindowChain(pParse, pWin, pList);
  }
  if( (pWin->eFrmType==TK_RANGE)
   && (pWin->pStart || pWin->pEnd)
   && (pWin->pOrderBy==0 || pWin->pOrderBy->nExpr!=1)
  ){
    sqlite3ErrorMsg(pParse,
      "RANGE with offset PRECEDING/FOLLOWING requires one ORDER BY expression"
    );
  }else
  if( pFunc->funcFlags & SQLITE_FUNC_WINDOW ){
    sqlite3 *db = pParse->db;
    if( pWin->pFilter ){
      sqlite3ErrorMsg(pParse,
          "FILTER clause may only be used with aggregate window functions"
      );
    }else{
      struct WindowUpdate {
        const char *zFunc;
        int eFrmType;
        int eStart;
        int eEnd;
      } aUp[] = {
        { row_numberName,   TK_ROWS,   TK_UNBOUNDED, TK_CURRENT },
        { dense_rankName,   TK_RANGE,  TK_UNBOUNDED, TK_CURRENT },
        { rankName,         TK_RANGE,  TK_UNBOUNDED, TK_CURRENT },
        { percent_rankName, TK_GROUPS, TK_CURRENT,   TK_UNBOUNDED },
        { cume_distName,    TK_GROUPS, TK_FOLLOWING, TK_UNBOUNDED },
        { ntileName,        TK_ROWS,   TK_CURRENT,   TK_UNBOUNDED },
        { leadName,         TK_ROWS,   TK_UNBOUNDED, TK_UNBOUNDED },
        { lagName,          TK_ROWS,   TK_UNBOUNDED, TK_CURRENT },
      };
      int i;
      for(i=0; i<ArraySize(aUp); i++){
        if( pFunc->zName==aUp[i].zFunc ){
          sqlite3ExprDelete(db, pWin->pStart);
          sqlite3ExprDelete(db, pWin->pEnd);
          pWin->pEnd = pWin->pStart = 0;
          pWin->eFrmType = aUp[i].eFrmType;
          pWin->eStart = aUp[i].eStart;
          pWin->eEnd = aUp[i].eEnd;
          pWin->eExclude = 0;
          if( pWin->eStart==TK_FOLLOWING ){
            pWin->pStart = sqlite3Expr(db, TK_INTEGER, "1");
          }
          break;
        }
      }
    }
  }
  pWin->pWFunc = pFunc;
}